

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spline.h
# Opt level: O2

void interpolate<int(*)[2],PointPlotter<int>>
               (int (*p0) [2],int (*pn) [2],PointPlotter<int> plot,double res)

{
  int (*paiVar1) [2];
  double x1;
  double dVar2;
  double y1;
  double x2;
  double y2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  double dVar5;
  
  for (paiVar1 = p0 + 2; paiVar1 != pn; paiVar1 = paiVar1 + 1) {
    x1 = (double)paiVar1[-1][0];
    x2 = (double)(*paiVar1)[0];
    if ((x1 != x2) || (NAN(x1) || NAN(x2))) {
      dVar2 = (double)paiVar1[-2][0];
      dVar5 = (double)paiVar1[1][0];
      if ((dVar2 != x1) || (NAN(dVar2) || NAN(x1))) {
        y2 = (double)(*paiVar1)[1];
        dVar2 = (y2 - (double)paiVar1[-2][1]) / (x2 - dVar2);
        if ((x2 != dVar5) || (NAN(x2) || NAN(dVar5))) {
          y1 = (double)paiVar1[-1][1];
          dVar5 = ((double)paiVar1[1][1] - y1) / (dVar5 - x1);
        }
        else {
          y1 = (double)paiVar1[-1][1];
          dVar5 = (((y2 - y1) * 3.0) / (x2 - x1) - dVar2) * 0.5;
        }
      }
      else {
        y1 = (double)paiVar1[-1][1];
        if ((x2 != dVar5) || (NAN(x2) || NAN(dVar5))) {
          y2 = (double)(*paiVar1)[1];
          auVar3._0_8_ = (y2 - y1) * 3.0;
          auVar3._8_8_ = (double)paiVar1[1][1] - y1;
          auVar4._8_8_ = dVar5 - x1;
          auVar4._0_8_ = x2 - x1;
          auVar4 = divpd(auVar3,auVar4);
          dVar5 = auVar4._8_8_;
          dVar2 = (auVar4._0_8_ - dVar5) * 0.5;
        }
        else {
          y2 = (double)(*paiVar1)[1];
          dVar5 = (y2 - y1) / (x2 - x1);
          dVar2 = dVar5;
        }
      }
      interpolate_forward_difference<PointPlotter<int>>(x1,y1,x2,y2,dVar2,dVar5,plot,res);
    }
  }
  return;
}

Assistant:

inline
void interpolate(PointIter p0, PointIter pn, PointPlotter plot, double res)
{
  double k1, k2;

  // Set up points for first curve segment.
  PointIter p1 = p0; ++p1;
  PointIter p2 = p1; ++p2;
  PointIter p3 = p2; ++p3;

  // Draw each curve segment.
  for (; p2 != pn; ++p0, ++p1, ++p2, ++p3) {
    // p1 and p2 equal; single point.
    if (x(p1) == x(p2)) {
      continue;
    }
    // Both end points repeated; straight line.
    if (x(p0) == x(p1) && x(p2) == x(p3)) {
      k1 = k2 = (y(p2) - y(p1))/(x(p2) - x(p1));
    }
    // p0 and p1 equal; use f''(x1) = 0.
    else if (x(p0) == x(p1)) {
      k2 = (y(p3) - y(p1))/(x(p3) - x(p1));
      k1 = (3*(y(p2) - y(p1))/(x(p2) - x(p1)) - k2)/2;
    }
    // p2 and p3 equal; use f''(x2) = 0.
    else if (x(p2) == x(p3)) {
      k1 = (y(p2) - y(p0))/(x(p2) - x(p0));
      k2 = (3*(y(p2) - y(p1))/(x(p2) - x(p1)) - k1)/2;
    }
    // Normal curve.
    else {
      k1 = (y(p2) - y(p0))/(x(p2) - x(p0));
      k2 = (y(p3) - y(p1))/(x(p3) - x(p1));
    }

    interpolate_segment(x(p1), y(p1), x(p2), y(p2), k1, k2, plot, res);
  }
}